

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicRotorWingAircraft.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::operator==
          (GED_BasicRotorWingAircraft *this,GED_BasicRotorWingAircraft *Value)

{
  KBOOL KVar1;
  
  KVar1 = GED_BasicFixedWingAircraft::operator!=
                    (&this->super_GED_BasicFixedWingAircraft,
                     &Value->super_GED_BasicFixedWingAircraft);
  if ((((KVar1) || (this->m_i8TrrtAz != Value->m_i8TrrtAz)) || (this->m_i8GnElv != Value->m_i8GnElv)
      ) || (this->m_i8TrrtSlwRt != Value->m_i8TrrtSlwRt)) {
    KVar1 = false;
  }
  else {
    KVar1 = this->m_i8GnElvRt == Value->m_i8GnElvRt;
  }
  return KVar1;
}

Assistant:

KBOOL GED_BasicRotorWingAircraft::operator == ( const GED_BasicRotorWingAircraft & Value ) const
{
    if( GED_BasicFixedWingAircraft::operator!=( Value ) )return false;
    if( m_i8TrrtAz    != Value.m_i8TrrtAz )    return false;
    if( m_i8GnElv     != Value.m_i8GnElv )     return false;
    if( m_i8TrrtSlwRt != Value.m_i8TrrtSlwRt ) return false;
    if( m_i8GnElvRt   != Value.m_i8GnElvRt )   return false;
    return true;
}